

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS
ref_facelift_edge_face_uv
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  double dVar1;
  REF_GEOM ref_geom;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  REF_INT cell_00;
  REF_INT ncell;
  double *local_228;
  REF_INT cell;
  REF_DBL faceuv [2];
  REF_DBL *local_208;
  REF_DBL t_local;
  REF_INT cells [2];
  REF_DBL local_1e8 [4];
  REF_DBL local_1c8 [3];
  REF_INT tuv_sense;
  REF_DBL bary [3];
  REF_INT tri_nodes [27];
  REF_INT edg_nodes [27];
  REF_INT local_a8 [2];
  REF_INT local_a0;
  REF_INT local_9c;
  
  ref_geom = ref_facelift->grid->geom;
  t_local = t;
  uVar3 = ref_egads_edge_face_uv(ref_geom,edgeid,faceid,sense,t,uv);
  if (uVar3 != 0) {
    pcVar7 = "edge uv";
    uVar5 = 0x367;
LAB_001b05ea:
    uVar6 = (ulong)uVar3;
    goto LAB_001b0669;
  }
  if (sense != 0) {
    return 0;
  }
  if (ref_facelift->displacement != (REF_DBL *)0x0) {
    return 0;
  }
  local_228 = uv;
  uVar3 = ref_facelift_enclosing(ref_facelift,1,edgeid,&t_local,&cell,bary);
  if (uVar3 != 0) {
    uVar6 = (ulong)uVar3;
    pcVar7 = "enclose";
    uVar5 = 0x371;
    goto LAB_001b0666;
  }
  if (cell == -1) {
    pcVar7 = "no enclosing found";
    uVar5 = 0x372;
    goto LAB_001b06ee;
  }
  uVar3 = ref_node_clip_bary2(bary,local_1c8);
  if (uVar3 == 0) {
    uVar3 = ref_node_clip_bary2(bary,local_1e8);
    if (uVar3 == 0) {
      uVar3 = ref_cell_nodes(ref_facelift->edg_cell,cell,edg_nodes);
      if (uVar3 == 0) {
        uVar3 = ref_cell_list_with2(ref_facelift->tri_cell,edg_nodes[0],edg_nodes[1],2,&ncell,cells)
        ;
        if (uVar3 == 0) {
          if (ncell < 1) {
            pcVar7 = "no tri found for edg";
            uVar5 = 0x37a;
LAB_001b06ee:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar5,"ref_facelift_edge_face_uv",pcVar7);
            return 1;
          }
          local_208 = local_1e8;
          cell_00 = -1;
          for (lVar4 = 0; lVar4 < ncell; lVar4 = lVar4 + 1) {
            uVar3 = ref_cell_nodes(ref_facelift->tri_cell,cells[lVar4],tri_nodes);
            if (uVar3 != 0) {
              uVar6 = (ulong)uVar3;
              pcVar7 = "tri nodes";
              uVar5 = 0x37e;
              goto LAB_001b0666;
            }
            if (tri_nodes[ref_facelift->tri_cell->node_per] == faceid) {
              if (cell_00 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x381,"ref_facelift_edge_face_uv","two tri found with id and sense=0",
                       0xffffffffffffffff,(long)cell_00);
                return 1;
              }
              cell_00 = cells[lVar4];
            }
          }
          if (cell_00 == -1) {
            pcVar7 = "edg tri not found with id";
            uVar5 = 0x385;
            goto LAB_001b06ee;
          }
          uVar3 = ref_cell_nodes(ref_facelift->tri_cell,cell_00,tri_nodes);
          if (uVar3 != 0) {
            pcVar7 = "edg tri nodes";
            uVar5 = 0x387;
            goto LAB_001b05ea;
          }
          local_a8[0] = tri_nodes[0];
          local_a8[1] = tri_nodes[1];
          local_a0 = tri_nodes[2];
          local_9c = tri_nodes[ref_facelift->tri_cell->node_per];
          uVar3 = ref_geom_find(ref_geom,edg_nodes[0],2,faceid,(REF_INT *)faceuv);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar7 = "geom";
            uVar5 = 0x391;
            goto LAB_001b0666;
          }
          if (ref_geom->descr[(long)faceuv[0]._0_4_ * 6 + 4] < 1) {
            if (ref_geom->descr[(long)faceuv[0]._0_4_ * 6 + 4] < 0) {
              local_1c8[0] = 0.0;
              pRVar2 = local_1c8;
              goto LAB_001b09e2;
            }
          }
          else {
            local_1e8[0] = 0.0;
            pRVar2 = local_1e8;
LAB_001b09e2:
            pRVar2[1] = 1.0;
          }
          uVar3 = ref_geom_find(ref_geom,edg_nodes[1],2,faceid,(REF_INT *)faceuv);
          if (uVar3 != 0) {
            pcVar7 = "geom";
            uVar5 = 0x39b;
LAB_001b0b65:
            uVar6 = (ulong)uVar3;
            goto LAB_001b0669;
          }
          if (ref_geom->descr[(long)faceuv[0]._0_4_ * 6 + 4] < 1) {
            if (ref_geom->descr[(long)faceuv[0]._0_4_ * 6 + 4] < 0) {
              local_1c8[0] = 1.0;
              local_208 = local_1c8;
              goto LAB_001b0a51;
            }
          }
          else {
            local_1e8[0] = 1.0;
LAB_001b0a51:
            local_208 = local_208 + 1;
            *local_208 = 0.0;
          }
          *local_228 = 0.0;
          local_228[1] = 0.0;
          for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
            uVar3 = ref_geom_cell_tuv(ref_geom,edg_nodes[lVar4],local_a8,2,faceuv,&tuv_sense);
            if (uVar3 != 0) {
              pcVar7 = "face uv";
              uVar5 = 0x3ab;
              goto LAB_001b0b65;
            }
            dVar1 = local_1e8[lVar4];
            *local_228 = local_1c8[lVar4] * (double)CONCAT44(faceuv[0]._4_4_,faceuv[0]._0_4_) +
                         *local_228;
            local_228[1] = dVar1 * faceuv[1] + local_228[1];
          }
          uVar3 = ref_facelift_edge_face_watertight(ref_facelift,edgeid,faceid,0,t_local,local_228);
          uVar6 = (ulong)uVar3;
          if (uVar3 == 0) {
            return 0;
          }
          pcVar7 = "facelift watertight check";
          uVar5 = 0x3b2;
        }
        else {
          uVar6 = (ulong)uVar3;
          pcVar7 = "more then two tris for edg";
          uVar5 = 0x379;
        }
      }
      else {
        uVar6 = (ulong)uVar3;
        pcVar7 = "edg nodes";
        uVar5 = 0x376;
      }
    }
    else {
      uVar6 = (ulong)uVar3;
      pcVar7 = "clip edge bary";
      uVar5 = 0x374;
    }
  }
  else {
    uVar6 = (ulong)uVar3;
    pcVar7 = "clip edge bary";
    uVar5 = 0x373;
  }
LAB_001b0666:
  uVar3 = (uint)uVar6;
LAB_001b0669:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar5,
         "ref_facelift_edge_face_uv",uVar6,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_uv(REF_FACELIFT ref_facelift,
                                             REF_INT edgeid, REF_INT faceid,
                                             REF_INT sense, REF_DBL t,
                                             REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT i, cell_node, cell, edg_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cells[2], edg_tri, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_DBL bary[3], clipu[3], clipv[3], faceuv[2];
  RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, uv),
      "edge uv");

  if (ref_facelift_direct(ref_facelift)) {
    if (0 != sense) {
      /* IMPLEMENT sense here, will need surrogate jump support */
      /* uses EGADS edgeUV */
      return REF_SUCCESS;
    }
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t, &cell,
                               bary),
        "enclose");
    RUS(REF_EMPTY, cell, "no enclosing found");
    RSS(ref_node_clip_bary2(bary, clipu), "clip edge bary");
    RSS(ref_node_clip_bary2(bary, clipv), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, edg_nodes),
        "edg nodes");
    RSS(ref_cell_list_with2(ref_facelift_tri(ref_facelift), edg_nodes[0],
                            edg_nodes[1], 2, &ncell, cells),
        "more then two tris for edg");
    RAS(ncell > 0, "no tri found for edg");
    edg_tri = REF_EMPTY;
    for (i = 0; i < ncell; i++) {
      RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cells[i], tri_nodes),
          "tri nodes");
      if (faceid ==
          tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))]) {
        REIS(REF_EMPTY, edg_tri, "two tri found with id and sense=0");
        edg_tri = cells[i];
      }
    }
    RUS(REF_EMPTY, edg_tri, "edg tri not found with id");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), edg_tri, tri_nodes),
        "edg tri nodes");
    linear_nodes[0] = tri_nodes[0];
    linear_nodes[1] = tri_nodes[1];
    linear_nodes[2] = tri_nodes[2];
    linear_nodes[3] =
        tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];

    { /* use the opposite node free uv for degen */
      REF_INT geom;
      RSS(ref_geom_find(ref_geom, edg_nodes[0], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 0.0;
        clipv[1] = 1.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 0.0;
        clipu[1] = 1.0;
      }
      RSS(ref_geom_find(ref_geom, edg_nodes[1], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 1.0;
        clipv[1] = 0.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 1.0;
        clipu[1] = 0.0;
      }
    }

    uv[0] = 0.0;
    uv[1] = 0.0;
    for (cell_node = 0; cell_node < 2; cell_node++) {
      RSS(ref_geom_cell_tuv(ref_geom, edg_nodes[cell_node], linear_nodes,
                            REF_GEOM_FACE, faceuv, &tuv_sense),
          "face uv");
      uv[0] += clipu[cell_node] * faceuv[0];
      uv[1] += clipv[cell_node] * faceuv[1];
    }

    RSS(ref_facelift_edge_face_watertight(ref_facelift, edgeid, faceid, sense,
                                          t, uv),
        "facelift watertight check");

  } else {
  }
  return REF_SUCCESS;
}